

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O3

void __thiscall
rcg::Buffer::setNodemap(Buffer *this,shared_ptr<GenApi_3_4::CNodeMapRef> *_nodemap,string *tltype)

{
  shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  int iVar4;
  CChunkAdapterGeneric *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  nodemap = &this->nodemap;
  (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->nodemap).
              super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(_nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  p_Var1 = (this->chunkadapter).
           super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->chunkadapter).super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->chunkadapter).super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if ((nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    bVar3 = getBoolean(nodemap,"ChunkModeActive",false,false);
    if (bVar3) {
      iVar4 = std::__cxx11::string::compare((char *)tltype);
      if (iVar4 == 0) {
        local_28 = (CChunkAdapterGeneric *)operator_new(0x18);
        GenApi_3_4::CChunkAdapterGEV::CChunkAdapterGEV
                  ((CChunkAdapterGEV *)local_28,
                   (((nodemap->
                     super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    )->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,-1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<GenApi_3_4::CChunkAdapterGEV*>(&_Stack_20,(CChunkAdapterGEV *)local_28);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)tltype);
        if (iVar4 == 0) {
          local_28 = (CChunkAdapterGeneric *)operator_new(0x18);
          GenApi_3_4::CChunkAdapterU3V::CChunkAdapterU3V
                    ((CChunkAdapterU3V *)local_28,
                     (((nodemap->
                       super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,-1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<GenApi_3_4::CChunkAdapterU3V*>(&_Stack_20,(CChunkAdapterU3V *)local_28);
        }
        else {
          local_28 = (CChunkAdapterGeneric *)operator_new(0x18);
          GenApi_3_4::CChunkAdapterGeneric::CChunkAdapterGeneric
                    (local_28,(((nodemap->
                                super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)
                              ._Ptr,-1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<GenApi_3_4::CChunkAdapterGeneric*>(&_Stack_20,local_28);
        }
      }
      _Var2._M_pi = _Stack_20._M_pi;
      _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->chunkadapter).
               super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      (this->chunkadapter).super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_28;
      (this->chunkadapter).super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var2._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
        }
      }
    }
  }
  return;
}

Assistant:

void Buffer::setNodemap(const std::shared_ptr<GenApi::CNodeMapRef> _nodemap, const std::string &tltype)
{
  nodemap=_nodemap;
  chunkadapter.reset();

  if (nodemap != 0)
  {
    if (getBoolean(nodemap, "ChunkModeActive", false))
    {
      if (tltype == "GEV")
      {
        chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterGEV(nodemap->_Ptr));
      }
      else if (tltype == "U3V")
      {
        chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterU3V(nodemap->_Ptr));
      }
      else
      {
        chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterGeneric(nodemap->_Ptr));
      }
    }
  }
}